

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.h
# Opt level: O0

VisionFeaturePrint_Scene * __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::mutable_scene(VisionFeaturePrint *this)

{
  bool bVar1;
  VisionFeaturePrint_Scene *this_00;
  VisionFeaturePrint *this_local;
  
  bVar1 = has_scene(this);
  if (!bVar1) {
    clear_VisionFeaturePrintType(this);
    set_has_scene(this);
    this_00 = (VisionFeaturePrint_Scene *)operator_new(0x18);
    VisionFeaturePrint_Scene::VisionFeaturePrint_Scene(this_00);
    (this->VisionFeaturePrintType_).scene_ = this_00;
  }
  return (this->VisionFeaturePrintType_).scene_;
}

Assistant:

inline ::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene* VisionFeaturePrint::mutable_scene() {
  if (!has_scene()) {
    clear_VisionFeaturePrintType();
    set_has_scene();
    VisionFeaturePrintType_.scene_ = new ::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.CoreMLModels.VisionFeaturePrint.scene)
  return VisionFeaturePrintType_.scene_;
}